

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  Iterator *a;
  Iterator *pIVar7;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *this_00;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *pvVar8;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *in_RDI;
  long in_FS_OFFSET;
  uint j_1;
  IntBitSet<unsigned_int> *__range3;
  ClusterIndex i_2;
  ClusterIndex j;
  ClusterIndex i_1;
  ClusterIndex i;
  IteratorEnd __end0;
  Iterator __begin0;
  IntBitSet<unsigned_int> to_merge;
  allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>
  *in_stack_ffffffffffffff68;
  Iterator *in_stack_ffffffffffffff70;
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  *in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::size((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
          *)in_stack_ffffffffffffff68);
  std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>::
  allocator(in_stack_ffffffffffffff68);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>::
  ~allocator(in_stack_ffffffffffffff68);
  local_34 = 0;
  while( true ) {
    uVar3 = (ulong)local_34;
    sVar4 = std::
            vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            ::size((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                    *)in_stack_ffffffffffffff68);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::
             vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             ::operator[]((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                           *)in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
    pvVar6 = std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::operator[](in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
    (pvVar6->feerate).fee = (pvVar5->first).fee;
    (pvVar6->feerate).size = (pvVar5->first).size;
    pvVar5 = std::
             vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             ::operator[]((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                           *)in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
    pvVar6 = std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::operator[](in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
    (pvVar6->ancestors).m_val = (pvVar5->second).m_val;
    std::
    vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ::operator[](in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
    bitset_detail::IntBitSet<unsigned_int>::Set
              ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff70,
               (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    a = (Iterator *)(ulong)local_38;
    pIVar7 = (Iterator *)
             std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::size((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     *)in_stack_ffffffffffffff68);
    if (pIVar7 <= a) break;
    std::
    vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  *)a,(size_type)in_stack_ffffffffffffff70);
    local_3c = 0;
    while( true ) {
      in_stack_ffffffffffffff70 = (Iterator *)(ulong)local_3c;
      pIVar7 = (Iterator *)
               std::
               vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ::size((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       *)in_stack_ffffffffffffff68);
      if (pIVar7 <= in_stack_ffffffffffffff70) break;
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    *)a,(size_type)in_stack_ffffffffffffff70);
      bVar2 = bitset_detail::IntBitSet<unsigned_int>::operator[]
                        ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff70,
                         (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (bVar2) {
        std::
        vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                      *)a,(size_type)in_stack_ffffffffffffff70);
        bitset_detail::IntBitSet<unsigned_int>::operator|=
                  ((IntBitSet<unsigned_int> *)a,(IntBitSet<unsigned_int> *)in_stack_ffffffffffffff70
                  );
      }
      local_3c = local_3c + 1;
    }
    local_38 = local_38 + 1;
  }
  local_40 = 0;
  while( true ) {
    this_00 = (vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               *)(ulong)local_40;
    pvVar8 = (vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              *)std::
                vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ::size(this_00);
    if (pvVar8 <= this_00) break;
    std::
    vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  *)a,(size_type)in_stack_ffffffffffffff70);
    bitset_detail::IntBitSet<unsigned_int>::begin
              ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff70);
    bitset_detail::IntBitSet<unsigned_int>::end((IntBitSet<unsigned_int> *)this_00);
    while (bVar2 = bitset_detail::operator==(a,(IteratorEnd *)in_stack_ffffffffffffff70),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator*(in_stack_ffffffffffffff70);
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    *)a,(size_type)in_stack_ffffffffffffff70);
      bitset_detail::IntBitSet<unsigned_int>::Set
                ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff70,(uint)((ulong)this_00 >> 0x20)
                );
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(in_stack_ffffffffffffff70);
    }
    local_40 = local_40 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit DepGraph(const Cluster<SetType>& cluster) noexcept : entries(cluster.size())
    {
        for (ClusterIndex i = 0; i < cluster.size(); ++i) {
            // Fill in fee and size.
            entries[i].feerate = cluster[i].first;
            // Fill in direct parents as ancestors.
            entries[i].ancestors = cluster[i].second;
            // Make sure transactions are ancestors of themselves.
            entries[i].ancestors.Set(i);
        }

        // Propagate ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            // At this point, entries[a].ancestors[b] is true iff b is an ancestor of a and there
            // is a path from a to b through the subgraph consisting of {a, b} union
            // {0, 1, ..., (i-1)}.
            SetType to_merge = entries[i].ancestors;
            for (ClusterIndex j = 0; j < entries.size(); ++j) {
                if (entries[j].ancestors[i]) {
                    entries[j].ancestors |= to_merge;
                }
            }
        }

        // Fill in descendant information by transposing the ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }